

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(void)

{
  time_t tVar1;
  void *pvVar2;
  vector<Player_*,_std::allocator<Player_*>_> *players_00;
  Tournament t;
  vector<Player_*,_std::allocator<Player_*>_> players;
  string *in_stack_fffffffffffff908;
  PlayerRandomDist *in_stack_fffffffffffff910;
  Tournament *this;
  string *in_stack_fffffffffffff918;
  PlayerAntiNext *in_stack_fffffffffffff920;
  allocator *paVar3;
  string *in_stack_fffffffffffff928;
  PlayerAlternate *in_stack_fffffffffffff930;
  string *in_stack_fffffffffffff938;
  PlayerMike_4 *in_stack_fffffffffffff940;
  PlayerAntiMike *this_00;
  string *in_stack_fffffffffffff948;
  PlayerMike_2 *in_stack_fffffffffffff950;
  int numGames;
  Tournament *this_01;
  Tournament *this_02;
  Tournament *this_03;
  undefined1 local_4d1 [33];
  void *local_4b0;
  undefined1 local_4a2;
  allocator local_4a1;
  string local_4a0 [32];
  void *local_480;
  undefined1 local_472;
  allocator local_471;
  string local_470 [32];
  void *local_450;
  undefined1 local_442;
  undefined1 local_441 [33];
  void *local_420;
  undefined1 local_412;
  allocator local_411;
  string local_410 [32];
  void *local_3f0;
  undefined1 local_3e2;
  allocator local_3e1;
  string local_3e0 [16];
  Tournament *in_stack_fffffffffffffc30;
  allocator local_3b1;
  string local_3b0 [32];
  void *local_390;
  undefined1 local_382;
  allocator local_381;
  string local_380 [32];
  vector<Player_*,_std::allocator<Player_*>_> *local_360;
  undefined1 local_352;
  undefined1 local_351 [33];
  void *local_330;
  undefined1 local_322;
  allocator local_321;
  string local_320 [32];
  void *local_300;
  undefined1 local_2f2;
  allocator local_2f1;
  string local_2f0 [32];
  void *local_2d0;
  undefined1 local_2c2;
  allocator local_2c1;
  string local_2c0 [32];
  void *local_2a0;
  undefined1 local_292;
  allocator local_291;
  string local_290 [32];
  void *local_270;
  undefined1 local_262;
  allocator local_261;
  string local_260 [32];
  void *local_240;
  undefined1 local_232;
  allocator local_231;
  string local_230 [32];
  void *local_210;
  undefined1 local_202;
  allocator local_201;
  string local_200 [32];
  void *local_1e0;
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0 [32];
  void *local_1b0;
  undefined1 local_1a2;
  allocator local_1a1;
  string local_1a0 [32];
  void *local_180;
  undefined1 local_172;
  undefined1 local_171 [33];
  void *local_150;
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  void *local_120;
  undefined1 local_112;
  undefined1 local_111 [33];
  void *local_f0;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [32];
  void *local_c0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  void *local_90;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  void *local_60;
  undefined1 local_52;
  allocator local_51;
  string local_50 [48];
  void *local_20;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  std::vector<Player_*,_std::allocator<Player_*>_>::vector
            ((vector<Player_*,_std::allocator<Player_*>_> *)0x1036a4);
  pvVar2 = operator_new(0x30);
  local_52 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"ROCK",&local_51);
  PlayerConst::PlayerConst
            ((PlayerConst *)in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (int)((ulong)in_stack_fffffffffffff910 >> 0x20));
  local_52 = 0;
  local_20 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pvVar2 = operator_new(0x30);
  local_82 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"PAPER",&local_81);
  PlayerConst::PlayerConst
            ((PlayerConst *)in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (int)((ulong)in_stack_fffffffffffff910 >> 0x20));
  local_82 = 0;
  local_60 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  pvVar2 = operator_new(0x30);
  local_b2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"SCISSORS",&local_b1);
  PlayerConst::PlayerConst
            ((PlayerConst *)in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (int)((ulong)in_stack_fffffffffffff910 >> 0x20));
  local_b2 = 0;
  local_90 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  pvVar2 = operator_new(0x30);
  local_e2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"CONST_2",&local_e1);
  PlayerConst_2::PlayerConst_2((PlayerConst_2 *)in_stack_fffffffffffff910,in_stack_fffffffffffff908)
  ;
  local_e2 = 0;
  local_c0 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  pvVar2 = operator_new(0x30);
  local_112 = 1;
  this_03 = (Tournament *)local_111;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_111 + 1),"ALTERNATE",(allocator *)this_03);
  PlayerAlternate::PlayerAlternate(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  local_112 = 0;
  local_f0 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string((string *)(local_111 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_111);
  pvVar2 = operator_new(0x30);
  local_142 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"CYCLE",&local_141);
  PlayerCycle::PlayerCycle((PlayerCycle *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_142 = 0;
  local_120 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  pvVar2 = operator_new(0x30);
  local_172 = 1;
  this_02 = (Tournament *)local_171;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_171 + 1),"CYCLE_2",(allocator *)this_02);
  PlayerCycle_2::PlayerCycle_2((PlayerCycle_2 *)in_stack_fffffffffffff910,in_stack_fffffffffffff908)
  ;
  local_172 = 0;
  local_150 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string((string *)(local_171 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_171);
  pvVar2 = operator_new(0x30);
  local_1a2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"CYCLE_3",&local_1a1);
  PlayerCycle_3::PlayerCycle_3((PlayerCycle_3 *)in_stack_fffffffffffff910,in_stack_fffffffffffff908)
  ;
  local_1a2 = 0;
  local_180 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  pvVar2 = operator_new(0x30);
  local_1d2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"COPY",&local_1d1);
  PlayerCopy::PlayerCopy
            ((PlayerCopy *)in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (int)((ulong)in_stack_fffffffffffff910 >> 0x20));
  local_1d2 = 0;
  local_1b0 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  pvVar2 = operator_new(0x30);
  local_202 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"NEXT",&local_201);
  PlayerNext::PlayerNext
            ((PlayerNext *)in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (int)((ulong)in_stack_fffffffffffff910 >> 0x20));
  local_202 = 0;
  local_1e0 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  pvVar2 = operator_new(0x28);
  local_232 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"NEXT_2",&local_231);
  PlayerNext_2::PlayerNext_2((PlayerNext_2 *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_232 = 0;
  local_210 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  pvVar2 = operator_new(0x30);
  local_262 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"ANTI_NEXT",&local_261);
  PlayerAntiNext::PlayerAntiNext
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,
             (int)((ulong)in_stack_fffffffffffff910 >> 0x20));
  local_262 = 0;
  local_240 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  pvVar2 = operator_new(0x38);
  local_292 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"RANDOM_DIST",&local_291);
  PlayerRandomDist::PlayerRandomDist(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_292 = 0;
  local_270 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  pvVar2 = operator_new(0x28);
  local_2c2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"RANDOM",&local_2c1);
  PlayerRandom::PlayerRandom((PlayerRandom *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_2c2 = 0;
  local_2a0 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  pvVar2 = operator_new(0x30);
  local_2f2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"MIKE",&local_2f1);
  PlayerMike::PlayerMike((PlayerMike *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_2f2 = 0;
  local_2d0 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  pvVar2 = operator_new(0x38);
  local_322 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"ASK",&local_321);
  PlayerAsk::PlayerAsk((PlayerAsk *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_322 = 0;
  local_300 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  pvVar2 = operator_new(0x60);
  local_352 = 1;
  this_01 = (Tournament *)local_351;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_351 + 1),"MIKE_2",(allocator *)this_01);
  PlayerMike_2::PlayerMike_2(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  local_352 = 0;
  local_330 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string((string *)(local_351 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_351);
  players_00 = (vector<Player_*,_std::allocator<Player_*>_> *)operator_new(0x40);
  local_382 = 1;
  paVar3 = &local_381;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"MIKE_3",paVar3);
  numGames = (int)((ulong)paVar3 >> 0x20);
  PlayerMike_3::PlayerMike_3((PlayerMike_3 *)in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  local_382 = 0;
  local_360 = players_00;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  pvVar2 = operator_new(0x40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"MIKE_4",&local_3b1);
  PlayerMike_4::PlayerMike_4(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  local_390 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  operator_new(0x28);
  local_3e2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"MADS",&local_3e1);
  PlayerMads::PlayerMads((PlayerMads *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_3e2 = 0;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  pvVar2 = operator_new(0x28);
  local_412 = 1;
  paVar3 = &local_411;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"DELAY",paVar3);
  PlayerDelay::PlayerDelay((PlayerDelay *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_412 = 0;
  local_3f0 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  pvVar2 = operator_new(0x40);
  local_442 = 1;
  this_00 = (PlayerAntiMike *)local_441;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_441 + 1),"ANTI_MIKE",(allocator *)this_00);
  PlayerAntiMike::PlayerAntiMike(this_00,in_stack_fffffffffffff938);
  local_442 = 0;
  local_420 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string((string *)(local_441 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_441);
  pvVar2 = operator_new(0x28);
  local_472 = 1;
  paVar3 = &local_471;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"DELAY_2",paVar3);
  PlayerDelay_2::PlayerDelay_2((PlayerDelay_2 *)in_stack_fffffffffffff910,in_stack_fffffffffffff908)
  ;
  local_472 = 0;
  local_450 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  pvVar2 = operator_new(0x28);
  local_4a2 = 1;
  paVar3 = &local_4a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"TERMINATOR",paVar3);
  PlayerTerminator::PlayerTerminator
            ((PlayerTerminator *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_4a2 = 0;
  local_480 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            ((vector<Player_*,_std::allocator<Player_*>_> *)in_stack_fffffffffffff910,
             (value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  pvVar2 = operator_new(0x28);
  this = (Tournament *)local_4d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_4d1 + 1),"DELAY_3",(allocator *)this);
  PlayerDelay_3::PlayerDelay_3((PlayerDelay_3 *)this,in_stack_fffffffffffff908);
  local_4b0 = pvVar2;
  std::vector<Player_*,_std::allocator<Player_*>_>::push_back
            (&this->m_players,(value_type *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string((string *)(local_4d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4d1);
  Tournament::Tournament(this_01,players_00,numGames);
  Tournament::play(in_stack_fffffffffffffc30);
  Tournament::showTable(this_02);
  Tournament::show(this_03);
  Tournament::~Tournament(this);
  std::vector<Player_*,_std::allocator<Player_*>_>::~vector
            ((vector<Player_*,_std::allocator<Player_*>_> *)paVar3);
  return 0;
}

Assistant:

int main()
{
   srand(time(0));

   std::vector<Player *> players;

   players.push_back(new PlayerConst(     "ROCK",       0));
   players.push_back(new PlayerConst(     "PAPER",      1));
   players.push_back(new PlayerConst(     "SCISSORS",   2));
   players.push_back(new PlayerConst_2(   "CONST_2"      ));
   players.push_back(new PlayerAlternate( "ALTERNATE"    ));
   players.push_back(new PlayerCycle(     "CYCLE"        ));
   players.push_back(new PlayerCycle_2(   "CYCLE_2"      ));
   players.push_back(new PlayerCycle_3(   "CYCLE_3"      ));
   players.push_back(new PlayerCopy(      "COPY",       0));
   players.push_back(new PlayerNext(      "NEXT",       0));
   players.push_back(new PlayerNext_2(    "NEXT_2"       ));
   players.push_back(new PlayerAntiNext(  "ANTI_NEXT",  0));
   players.push_back(new PlayerRandomDist("RANDOM_DIST"  ));
   players.push_back(new PlayerRandom(    "RANDOM"       ));
   players.push_back(new PlayerMike(      "MIKE"         ));
   players.push_back(new PlayerAsk(       "ASK"          ));
   players.push_back(new PlayerMike_2(    "MIKE_2"       ));
   players.push_back(new PlayerMike_3(    "MIKE_3"       ));
   players.push_back(new PlayerMike_4(    "MIKE_4"       ));
   players.push_back(new PlayerMads(      "MADS"         ));
   players.push_back(new PlayerDelay(     "DELAY"        ));
   players.push_back(new PlayerAntiMike(  "ANTI_MIKE"    ));
   players.push_back(new PlayerDelay_2 (  "DELAY_2"      ));
   players.push_back(new PlayerTerminator("TERMINATOR"   ));
   players.push_back(new PlayerDelay_3(   "DELAY_3"      ));
   Tournament t(players, numGames);
   
   t.play();

   t.showTable();
   t.show();
}